

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O1

void Fl::get_system_colors(void)

{
  Fl_Window *pFVar1;
  char *pcVar2;
  char *key1;
  
  fl_open_display();
  pFVar1 = first_window();
  if (pFVar1 == (Fl_Window *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pFVar1 = first_window();
    pcVar2 = Fl_Window::xclass(pFVar1);
  }
  key1 = "fltk";
  if (pcVar2 != (char *)0x0) {
    key1 = pcVar2;
  }
  if (fl_bg2_set == '\0') {
    getsyscolor("Text","background",fl_bg2,"#ffffff",background2);
  }
  if (fl_fg_set == '\0') {
    getsyscolor(key1,"foreground",fl_fg,"#000000",foreground);
  }
  if (fl_bg_set == '\0') {
    getsyscolor(key1,"background",fl_bg,"#c0c0c0",background);
  }
  getsyscolor("Text","selectBackground",(char *)0x0,"#000080",set_selection_color);
  return;
}

Assistant:

void Fl::get_system_colors()
{
  fl_open_display();
  const char* key1 = 0;
  if (Fl::first_window()) key1 = Fl::first_window()->xclass();
  if (!key1) key1 = "fltk";
  if (!fl_bg2_set) getsyscolor("Text","background",	fl_bg2,	"#ffffff", Fl::background2);
  if (!fl_fg_set) getsyscolor(key1,  "foreground",	fl_fg,	"#000000", Fl::foreground);
  if (!fl_bg_set) getsyscolor(key1,  "background",	fl_bg,	"#c0c0c0", Fl::background);
  getsyscolor("Text", "selectBackground", 0, "#000080", set_selection_color);
}